

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Matrix * MatrixZero(uint32_t rows,uint32_t columns)

{
  Matrix *pMVar1;
  Real *pRVar2;
  
  if ((rows == 0) || (columns == 0)) {
    pMVar1 = (Matrix *)0x0;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d >= 1x1)\n","MatrixZero",(ulong)rows,(ulong)columns
           );
  }
  else {
    pMVar1 = (Matrix *)calloc(1,0x10);
    pMVar1->rows = rows;
    pMVar1->columns = columns;
    pMVar1->matrix = (Real *)0x0;
    pRVar2 = (Real *)calloc(1,(ulong)columns * (ulong)rows * 0x10);
    pMVar1->matrix = pRVar2;
  }
  return pMVar1;
}

Assistant:

Matrix *MatrixZero(uint32_t rows, uint32_t columns) {
#ifndef NDEBUG
  if (rows == 0 || columns == 0) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d >= 1x1)\n", __FUNCTION_NAME__, rows, columns);
    return NULL;
  }
#endif
  Matrix *new = (Matrix *)calloc(1, sizeof(Matrix));
  *new = (Matrix){rows, columns, NULL};
  new->matrix = (Real *)calloc(1, sizeof(Real) * rows * columns);
  return new;
}